

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator*(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  uint uVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  iterator __position;
  int iVar6;
  Blade in_RAX;
  pointer pBVar7;
  float *pfVar8;
  ulong uVar9;
  pointer pBVar10;
  long lVar11;
  uint uVar12;
  float fVar13;
  Blade local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = dim;
  uVar9 = (ulong)dim;
  local_38 = in_RAX;
  if (0 < (long)uVar9) {
    memset(Re,0,uVar9 * 4);
  }
  pBVar7 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pBVar7 != pBVar3) {
    pBVar4 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar5 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      pfVar8 = Re;
      if (pBVar4 != pBVar5) {
        uVar2 = pBVar7->mBase;
        pBVar10 = pBVar4;
        do {
          fVar13 = pBVar7->mVal * pBVar10->mVal;
          if (1e-06 < ABS(fVar13)) {
            uVar12 = pBVar10->mBase ^ uVar2;
            pfVar8[(int)uVar12] =
                 (float)signs[(int)uVar2][pBVar10->mBase] * fVar13 + pfVar8[(int)uVar12];
          }
          pBVar10 = pBVar10 + 1;
        } while (pBVar10 != pBVar5);
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar3);
  }
  if (0 < iVar6) {
    lVar11 = 0;
    pfVar8 = Re;
    do {
      if (1e-06 < ABS(pfVar8[lVar11])) {
        Blade::Blade(&local_38,(int)lVar11,pfVar8[lVar11]);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        uVar9 = (ulong)(uint)dim;
        pfVar8 = Re;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator*(Clifford A, Clifford B)
{
    Clifford R; 
	for(int i=0;i<dim;i++)Re[i]=0;

    idx a=A.begin();
	while(a!=A.end())
	{	
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			float prd=(a->mVal)*(b->mVal);
			if(fabs(prd)>Error2)
			{
				Re[am^bm]+=signs[am][bm]*prd;
			}
			b++;
		}
		a++;
	}

    
	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
	
	//delete Re;
	return R;
}